

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderTag.cpp
# Opt level: O2

int __thiscall
HeaderTag::verify(HeaderTag *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
                 size_t tbslen)

{
  pointer ppSVar1;
  long lVar2;
  ostream *poVar3;
  
  poVar3 = (ostream *)Tag::elements(&this->super_Tag);
  ppSVar1 = *(pointer *)(poVar3 + 8);
  lVar2 = *(long *)poVar3;
  if (0x10 < (ulong)((long)ppSVar1 - lVar2)) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error: (HeaderTag): too many entries!");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  }
  return (int)CONCAT71((int7)((ulong)poVar3 >> 8),(ulong)((long)ppSVar1 - lVar2) < 0x11);
}

Assistant:

bool HeaderTag::verify()
{
	if (elements().size() > 2)
	{
		std::cerr << "Error: (HeaderTag): too many entries!" << std::endl;
		return false;
	}

	return true;
}